

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O3

QGraphicsPixmapItem * __thiscall QGraphicsPixmapItem::shape(QGraphicsPixmapItem *this)

{
  long in_RSI;
  QGraphicsPixmapItemPrivate *thatD;
  QGraphicsPixmapItemPrivate *this_00;
  
  this_00 = *(QGraphicsPixmapItemPrivate **)(in_RSI + 8);
  if (this_00->hasShape == false) {
    QGraphicsPixmapItemPrivate::updateShape(this_00);
    this_00->hasShape = true;
    this_00 = *(QGraphicsPixmapItemPrivate **)(in_RSI + 8);
  }
  QPainterPath::QPainterPath((QPainterPath *)this,&this_00->shape);
  return this;
}

Assistant:

QPainterPath QGraphicsPixmapItem::shape() const
{
    Q_D(const QGraphicsPixmapItem);
    if (!d->hasShape) {
        QGraphicsPixmapItemPrivate *thatD = const_cast<QGraphicsPixmapItemPrivate *>(d);
        thatD->updateShape();
        thatD->hasShape = true;
    }
    return d_func()->shape;
}